

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void __thiscall
xlib::Log::
SWrite<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
          (Log *this,LOG_PRIORITY pri,char *file,uint32_t line,char *function,bool br,string *format
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,int *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  pointer pcVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + format->_M_string_length);
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (this,&local_50,args,args_1,args_2,args_3,args_4);
  Write(this,pri,file,line,function,br,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SWrite(LOG_PRIORITY pri, const char* file, uint32_t line, const char* function,
        bool br, const std::string& format, const Args&... args) {
        std::string temp(format);
        Format(&temp, args...);
        Write(pri, file, line, function, br, temp.c_str());
    }